

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SolverTypes.h
# Opt level: O0

void __thiscall
Minisat::OccLists<int,_Minisat::vec<unsigned_int>,_Minisat::SimpSolver::ClauseDeleted>::cleanAll
          (OccLists<int,_Minisat::vec<unsigned_int>,_Minisat::SimpSolver::ClauseDeleted> *this)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  char *pcVar4;
  long in_RDI;
  int *in_stack_00000008;
  OccLists<int,_Minisat::vec<unsigned_int>,_Minisat::SimpSolver::ClauseDeleted> *in_stack_00000010;
  int i;
  vec<char> *in_stack_ffffffffffffffd8;
  undefined1 dealloc;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 local_c;
  
  local_c = 0;
  while( true ) {
    dealloc = (undefined1)((ulong)in_stack_ffffffffffffffd8 >> 0x38);
    iVar2 = local_c;
    iVar1 = vec<int>::size((vec<int> *)(in_RDI + 0x20));
    if (iVar1 <= iVar2) break;
    in_stack_ffffffffffffffd8 = (vec<char> *)(in_RDI + 0x10);
    piVar3 = vec<int>::operator[]((vec<int> *)(in_RDI + 0x20),local_c);
    iVar2 = toInt(*piVar3);
    pcVar4 = vec<char>::operator[](in_stack_ffffffffffffffd8,iVar2);
    if (*pcVar4 != '\0') {
      vec<int>::operator[]((vec<int> *)(in_RDI + 0x20),local_c);
      clean(in_stack_00000010,in_stack_00000008);
    }
    local_c = local_c + 1;
  }
  vec<int>::clear((vec<int> *)CONCAT44(iVar2,in_stack_ffffffffffffffe0),(bool)dealloc);
  return;
}

Assistant:

void OccLists<Idx, Vec, Deleted>::cleanAll()
{
    for (int i = 0; i < dirties.size(); i++)
        // Dirties may contain duplicates so check here if a variable is already cleaned:
        if (dirty[toInt(dirties[i])]) clean(dirties[i]);
    dirties.clear();
}